

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall GlobOpt::FindArraySegmentLoadInstr(GlobOpt *this,Instr *fromInstr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  bool local_29;
  Instr *local_28;
  Instr *headSegmentLengthLoad;
  Instr *fromInstr_local;
  GlobOpt *this_local;
  
  local_28 = fromInstr;
  do {
    local_28 = local_28->m_prev;
    if (local_28 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x433d,"(headSegmentLengthLoad)","headSegmentLengthLoad");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    IVar3 = IR::Instr::GetKind(local_28);
    local_29 = true;
    if (IVar3 != InstrKindLabel) {
      local_29 = IR::Instr::IsProfiledLabelInstr(local_28);
    }
    if (local_29 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x433e,"(!headSegmentLengthLoad->IsLabelInstr())",
                         "!headSegmentLengthLoad->IsLabelInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  } while (local_28->m_opcode != LdIndir);
  return local_28;
}

Assistant:

IR::Instr*
GlobOpt::FindArraySegmentLoadInstr(IR::Instr* fromInstr)
{
    IR::Instr *headSegmentLengthLoad = fromInstr;
    do
    {
        headSegmentLengthLoad = headSegmentLengthLoad->m_prev;
        Assert(headSegmentLengthLoad);
        Assert(!headSegmentLengthLoad->IsLabelInstr());
    } while (headSegmentLengthLoad->m_opcode != Js::OpCode::LdIndir);
    return headSegmentLengthLoad;
}